

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execLink<(moira::Core)0,(moira::Instr)68,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  u32 *puVar1;
  u16 uVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  ulong uVar6;
  
  uVar4 = (this->reg).field_3.field_0.a[7];
  uVar2 = (this->queue).irc;
  uVar5 = (this->reg).pc + 2;
  (this->reg).pc = uVar5;
  uVar5 = read<(moira::Core)0,(moira::AddrSpace)2,2,0ull>(this,uVar5);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  (this->reg).ipl = this->ipl;
  uVar6 = (ulong)(opcode & 7);
  iVar3 = *(int *)((long)&(this->reg).field_3 + uVar6 * 4 + 0x20);
  uVar5 = (this->reg).field_3.field_0.a[7] - 4;
  (this->reg).field_3.field_0.a[7] = uVar5;
  write<(moira::Core)0,(moira::AddrSpace)1,4,0ull>
            (this,uVar5,(iVar3 + (uint)((~(uint)opcode & 7) != 0) * 4) - 4);
  *(u32 *)((long)&(this->reg).field_3 + uVar6 * 4 + 0x20) = uVar4 - 4;
  puVar1 = (this->reg).field_3.field_0.a + 7;
  *puVar1 = *puVar1 + (int)(short)uVar2;
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = read<(moira::Core)0,(moira::AddrSpace)2,2,0ull>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  (*this->_vptr_Moira[2])(this,0x10);
  return;
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;

    int ax   = _____________xxx(opcode);
    i32 disp = SEXT <S> (readI<C, S>());

    // Check for address error
    if (misaligned<C>(sp)) {

        writeBuffer = u16(readA(ax) >> 16);
        writeA(ax, sp);
        throw AddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
    }

    POLL_IPL;

    // Write to stack
    push <C, Long>(readA(ax) - ((MOIRA_MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp = U32_ADD(reg.sp, disp);

    prefetch<C>();

    //           00  10  20        00  10  20        00  10  20
    //           .b  .b  .b        .w  .w  .w        .l  .l  .l
    CYCLES_IP   ( 0,  0,  0,       16, 16,  5,        0,  0,  6);

    FINALIZE
}